

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2CDataBlock(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  int local_34;
  int local_30;
  int n_len;
  int len;
  int n_value;
  xmlChar *value;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (value._4_4_ = 0; (int)value._4_4_ < 2; value._4_4_ = value._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_void_ptr(value._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(n_len,1);
        local_30 = gen_int(local_34,2);
        if (val_00 != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_30) {
            local_30 = 0;
          }
        }
        xmlSAX2CDataBlock(val,val_00,local_30);
        call_tests = call_tests + 1;
        des_void_ptr(value._4_4_,val,0);
        des_const_xmlChar_ptr(n_len,val_00,1);
        des_int(local_34,local_30,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2CDataBlock",(ulong)(uint)(iVar2 - iVar1));
          ctx._4_4_ = ctx._4_4_ + 1;
          printf(" %d",(ulong)value._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2CDataBlock(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * value; /* The pcdata content */
    int n_value;
    int len; /* the block length */
    int n_len;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        value = gen_const_xmlChar_ptr(n_value, 1);
        len = gen_int(n_len, 2);
        if ((value != NULL) &&
            (len > xmlStrlen(BAD_CAST value)))
            len = 0;

        xmlSAX2CDataBlock(ctx, value, len);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_value, value, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2CDataBlock",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_value);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}